

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O1

int Imf_2_5::hufCompress(unsigned_short *raw,int nRaw,char *compressed)

{
  long *plVar1;
  char *pcVar2;
  long lVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong *puVar6;
  ushort uVar7;
  int iVar8;
  void *__s;
  ulong uVar9;
  void *__s_00;
  long *__s_01;
  long *plVar10;
  long lVar11;
  Int64 *hcode;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong *puVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  char *pcVar22;
  int iVar23;
  char *pcVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  bool bVar29;
  int local_8c;
  
  if (nRaw == 0) {
    iVar18 = 0;
  }
  else {
    __s = operator_new__(0x80008);
    memset(__s,0,0x80008);
    if (0 < nRaw) {
      uVar9 = 0;
      do {
        plVar10 = (long *)((long)__s + (ulong)raw[uVar9] * 8);
        *plVar10 = *plVar10 + 1;
        uVar9 = uVar9 + 1;
      } while ((uint)nRaw != uVar9);
    }
    __s_00 = operator_new__(0x40004);
    memset(__s_00,0,0x40004);
    __s_01 = (long *)operator_new__(0x80008);
    memset(__s_01,0,0x80008);
    plVar10 = (long *)((long)__s + -8);
    uVar9 = 0xffffffffffffffff;
    do {
      uVar9 = uVar9 + 1;
      plVar1 = plVar10 + 1;
      plVar10 = plVar10 + 1;
    } while (*plVar1 == 0);
    local_8c = 0;
    iVar18 = 0;
    if (uVar9 < 0x10001) {
      local_8c = 0;
      iVar18 = 0;
      uVar14 = uVar9;
      do {
        *(int *)((long)__s_00 + uVar14 * 4) = (int)uVar14;
        if (*plVar10 != 0) {
          __s_01[iVar18] = (long)plVar10;
          iVar18 = iVar18 + 1;
          local_8c = (int)uVar14;
        }
        uVar14 = uVar14 + 1;
        plVar10 = plVar10 + 1;
      } while (uVar14 != 0x10001);
    }
    lVar11 = (long)local_8c;
    puVar15 = (ulong *)((long)__s + lVar11 * 8 + 8);
    *(undefined8 *)((long)__s + lVar11 * 8 + 8) = 1;
    __s_01[iVar18] = (long)puVar15;
    uVar13 = iVar18 + 1;
    if (0 < iVar18) {
      uVar14 = (long)(int)uVar13 - 2U >> 1;
      do {
        std::
        __adjust_heap<unsigned_long**,long,unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<Imf_2_5::(anonymous_namespace)::FHeapCompare>>
                  (__s_01,uVar14,(long)(int)uVar13);
        bVar29 = uVar14 != 0;
        uVar14 = uVar14 - 1;
      } while (bVar29);
    }
    hcode = (Int64 *)operator_new__(0x80008);
    lVar11 = lVar11 + 1;
    memset(hcode,0,0x80008);
    if (0 < iVar18) {
      uVar14 = (ulong)uVar13;
      do {
        lVar12 = *__s_01;
        lVar17 = __s_01[uVar14 - 1];
        __s_01[uVar14 - 1] = lVar12;
        std::
        __adjust_heap<unsigned_long**,long,unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<Imf_2_5::(anonymous_namespace)::FHeapCompare>>
                  (__s_01,0,(long)(uVar14 * 8 + -8) >> 3,lVar17);
        uVar25 = uVar14 - 1;
        lVar17 = *__s_01;
        if (1 < uVar25) {
          lVar3 = __s_01[uVar14 - 2];
          __s_01[uVar14 - 2] = lVar17;
          std::
          __adjust_heap<unsigned_long**,long,unsigned_long*,__gnu_cxx::__ops::_Iter_comp_iter<Imf_2_5::(anonymous_namespace)::FHeapCompare>>
                    (__s_01,0,(long)(uVar14 * 8 + -0x10) >> 3,lVar3);
        }
        uVar20 = (ulong)(lVar12 - (long)__s) >> 3;
        uVar21 = (ulong)(lVar17 - (long)__s) >> 3;
        plVar10 = (long *)((long)__s + (long)(int)uVar21 * 8);
        *plVar10 = *plVar10 + *(long *)((long)__s + (long)(int)uVar20 * 8);
        puVar4 = (ulong *)__s_01[uVar14 - 2];
        lVar12 = uVar14 - 2;
        if (1 < uVar25) {
          uVar5 = *puVar4;
          do {
            lVar17 = (lVar12 - (lVar12 + -1 >> 0x3f)) + -1 >> 1;
            puVar6 = (ulong *)__s_01[lVar17];
            if ((*puVar6 <= uVar5) && ((puVar6 <= puVar4 || (*puVar6 != uVar5)))) break;
            __s_01[lVar12] = (long)puVar6;
            bVar29 = 2 < lVar12;
            lVar12 = lVar17;
          } while (bVar29);
        }
        __s_01[lVar12] = (long)puVar4;
        do {
          uVar16 = (uint)uVar21;
          lVar12 = (long)(int)uVar16;
          hcode[lVar12] = hcode[lVar12] + 1;
          uVar13 = *(uint *)((long)__s_00 + lVar12 * 4);
          uVar21 = (ulong)uVar13;
        } while (uVar13 != uVar16);
        *(int *)((long)__s_00 + lVar12 * 4) = (int)uVar20;
        do {
          uVar16 = (uint)uVar20;
          hcode[(int)uVar16] = hcode[(int)uVar16] + 1;
          uVar13 = *(uint *)((long)__s_00 + (long)(int)uVar16 * 4);
          uVar20 = (ulong)uVar13;
        } while (uVar13 != uVar16);
        iVar18 = (int)uVar14;
        uVar14 = uVar25;
      } while (2 < iVar18);
    }
    anon_unknown_0::hufCanonicalCodeTable(hcode);
    memcpy(__s,hcode,0x80008);
    operator_delete__(hcode);
    operator_delete__(__s_01);
    operator_delete__(__s_00);
    pcVar2 = compressed + 0x14;
    pcVar22 = pcVar2;
    if ((int)lVar11 < (int)uVar9) {
      uVar25 = 0;
      iVar26 = 0;
    }
    else {
      uVar25 = 0;
      uVar14 = uVar9;
      iVar18 = 0;
      do {
        iVar8 = (int)uVar14;
        lVar12 = (long)iVar8;
        uVar14 = *(ulong *)((long)__s + lVar12 * 8) & 0x3f;
        if (uVar14 == 0) {
          uVar13 = 1;
          if (iVar8 <= local_8c) {
            uVar16 = 1;
            while (uVar13 = uVar16, (*(byte *)((long)__s + lVar12 * 8 + 8) & 0x3f) == 0) {
              lVar12 = lVar12 + 1;
              uVar13 = uVar16 + 1;
              if ((lVar11 <= lVar12) || (bVar29 = 0x103 < uVar16, uVar16 = uVar13, bVar29)) break;
            }
            iVar8 = (int)lVar12;
          }
          if (uVar13 < 2) goto LAB_0043c3c9;
          if (uVar13 < 6) {
            uVar25 = uVar25 << 6 | (ulong)(uVar13 + 0x39);
            iVar26 = iVar18 + 6;
            if (iVar18 < 2) goto LAB_0043c406;
            iVar18 = iVar18 + 0xe;
            do {
              iVar26 = iVar26 + -8;
              *pcVar22 = (char)(uVar25 >> ((byte)iVar26 & 0x3f));
              pcVar22 = pcVar22 + 1;
              iVar18 = iVar18 + -8;
            } while (0xf < iVar18);
            goto LAB_0043c3ff;
          }
          iVar23 = iVar18 + 6;
          uVar14 = uVar25 << 6 | 0x3f;
          if (1 < iVar18) {
            iVar18 = iVar18 + 0xe;
            do {
              iVar26 = iVar18;
              iVar23 = iVar23 + -8;
              *pcVar22 = (char)(uVar14 >> ((byte)iVar23 & 0x3f));
              pcVar22 = pcVar22 + 1;
              iVar18 = iVar26 + -8;
            } while (0xf < iVar18);
            iVar23 = iVar26 + -0x10;
          }
          uVar25 = uVar14 << 8 | (ulong)(uVar13 - 6);
          iVar26 = iVar23 + 8;
          if (-1 < iVar23) {
            iVar18 = iVar23 + 0x10;
            do {
              iVar23 = iVar18;
              iVar26 = iVar26 + -8;
              *pcVar22 = (char)(uVar25 >> ((byte)iVar26 & 0x3f));
              pcVar22 = pcVar22 + 1;
              iVar18 = iVar23 + -8;
            } while (0xf < iVar18);
            iVar26 = iVar23 + -0x10;
          }
        }
        else {
LAB_0043c3c9:
          uVar25 = uVar14 | uVar25 << 6;
          iVar26 = iVar18 + 6;
          if (1 < iVar18) {
            iVar18 = iVar18 + 0xe;
            do {
              iVar26 = iVar26 + -8;
              *pcVar22 = (char)(uVar25 >> ((byte)iVar26 & 0x3f));
              pcVar22 = pcVar22 + 1;
              iVar18 = iVar18 + -8;
            } while (0xf < iVar18);
LAB_0043c3ff:
            iVar26 = iVar18 + -8;
          }
        }
LAB_0043c406:
        uVar14 = (ulong)(iVar8 + 1);
        iVar18 = iVar26;
      } while (iVar8 <= local_8c);
    }
    if (0 < iVar26) {
      *pcVar22 = (char)(uVar25 << (8U - (char)iVar26 & 0x3f));
      pcVar22 = pcVar22 + 1;
    }
    uVar7 = *raw;
    pcVar24 = pcVar22;
    if (nRaw < 2) {
      uVar14 = 0;
      iVar18 = 0;
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      uVar25 = 1;
      iVar18 = 0;
      uVar14 = 0;
      do {
        if (iVar8 < 0xff && uVar7 == raw[uVar25]) {
          iVar26 = iVar8 + 1;
        }
        else {
          uVar20 = *(ulong *)((long)__s + (ulong)uVar7 * 8);
          uVar21 = *puVar15;
          uVar19 = (uint)uVar20;
          uVar13 = uVar19 & 0x3f;
          uVar27 = (uint)uVar21;
          uVar16 = uVar27 & 0x3f;
          if ((ulong)uVar13 + (ulong)uVar16 + 8 < (ulong)uVar13 * (long)iVar8) {
            uVar14 = uVar14 << (sbyte)uVar13 | uVar20 >> 6;
            iVar18 = (uVar19 & 0x3f) + iVar18;
            iVar23 = iVar18;
            iVar26 = iVar18;
            if (7 < iVar18) {
              do {
                *pcVar24 = (char)(uVar14 >> ((byte)(iVar23 + -8) & 0x3f));
                pcVar24 = pcVar24 + 1;
                iVar26 = iVar18 + -8;
                bVar29 = 0xf < iVar18;
                iVar18 = iVar26;
                iVar23 = iVar23 + -8;
              } while (bVar29);
            }
            iVar26 = (uVar27 & 0x3f) + iVar26;
            uVar14 = uVar14 << (sbyte)uVar16 | uVar21 >> 6;
            iVar18 = iVar26;
            iVar23 = iVar26;
            if (7 < iVar26) {
              do {
                *pcVar24 = (char)(uVar14 >> ((byte)(iVar18 + -8) & 0x3f));
                pcVar24 = pcVar24 + 1;
                iVar23 = iVar26 + -8;
                bVar29 = 0xf < iVar26;
                iVar26 = iVar23;
                iVar18 = iVar18 + -8;
              } while (bVar29);
            }
            iVar18 = iVar23 + 8;
            uVar14 = uVar14 << 8 | (long)iVar8;
            iVar26 = 0;
            if (-1 < iVar23) {
              iVar8 = iVar23 + 0x10;
              do {
                iVar23 = iVar8;
                iVar18 = iVar18 + -8;
                *pcVar24 = (char)(uVar14 >> ((byte)iVar18 & 0x3f));
                pcVar24 = pcVar24 + 1;
                iVar8 = iVar23 + -8;
              } while (0xf < iVar8);
              iVar18 = iVar23 + -0x10;
            }
          }
          else {
            iVar26 = 0;
            if (-1 < iVar8) {
              do {
                iVar18 = iVar18 + (uVar19 & 0x3f);
                uVar14 = uVar14 << (sbyte)uVar13 | uVar20 >> 6;
                iVar28 = iVar18;
                iVar23 = iVar18;
                if (7 < iVar18) {
                  do {
                    *pcVar24 = (char)(uVar14 >> ((byte)(iVar23 + -8) & 0x3f));
                    pcVar24 = pcVar24 + 1;
                    iVar18 = iVar28 + -8;
                    bVar29 = 0xf < iVar28;
                    iVar28 = iVar18;
                    iVar23 = iVar23 + -8;
                  } while (bVar29);
                }
                bVar29 = 0 < iVar8;
                iVar8 = iVar8 + -1;
              } while (bVar29);
            }
          }
        }
        iVar8 = iVar26;
        uVar7 = raw[uVar25];
        uVar25 = uVar25 + 1;
      } while (uVar25 != (uint)nRaw);
    }
    uVar25 = *(ulong *)((long)__s + (ulong)uVar7 * 8);
    uVar20 = *puVar15;
    uVar19 = (uint)uVar25;
    uVar13 = uVar19 & 0x3f;
    uVar27 = (uint)uVar20;
    uVar16 = uVar27 & 0x3f;
    if ((ulong)uVar13 + (ulong)uVar16 + 8 < (ulong)uVar13 * (long)iVar8) {
      uVar14 = uVar14 << (sbyte)uVar13 | uVar25 >> 6;
      iVar18 = (uVar19 & 0x3f) + iVar18;
      iVar23 = iVar18;
      iVar26 = iVar18;
      if (7 < iVar18) {
        do {
          *pcVar24 = (char)(uVar14 >> ((byte)(iVar23 + -8) & 0x3f));
          pcVar24 = pcVar24 + 1;
          iVar26 = iVar18 + -8;
          bVar29 = 0xf < iVar18;
          iVar18 = iVar26;
          iVar23 = iVar23 + -8;
        } while (bVar29);
      }
      iVar26 = (uVar27 & 0x3f) + iVar26;
      uVar14 = uVar14 << (sbyte)uVar16 | uVar20 >> 6;
      iVar18 = iVar26;
      iVar23 = iVar26;
      if (7 < iVar26) {
        do {
          *pcVar24 = (char)(uVar14 >> ((byte)(iVar18 + -8) & 0x3f));
          pcVar24 = pcVar24 + 1;
          iVar23 = iVar26 + -8;
          bVar29 = 0xf < iVar26;
          iVar26 = iVar23;
          iVar18 = iVar18 + -8;
        } while (bVar29);
      }
      iVar18 = iVar23 + 8;
      uVar14 = uVar14 << 8 | (long)iVar8;
      if (-1 < iVar23) {
        iVar8 = iVar23 + 0x10;
        do {
          iVar26 = iVar8;
          iVar18 = iVar18 + -8;
          *pcVar24 = (char)(uVar14 >> ((byte)iVar18 & 0x3f));
          pcVar24 = pcVar24 + 1;
          iVar8 = iVar26 + -8;
        } while (0xf < iVar8);
        iVar18 = iVar26 + -0x10;
      }
    }
    else if (-1 < iVar8) {
      do {
        iVar23 = iVar18 + (uVar19 & 0x3f);
        uVar14 = uVar14 << (sbyte)uVar13 | uVar25 >> 6;
        iVar26 = iVar23;
        iVar18 = iVar23;
        if (7 < iVar23) {
          do {
            *pcVar24 = (char)(uVar14 >> ((byte)(iVar26 + -8) & 0x3f));
            pcVar24 = pcVar24 + 1;
            iVar18 = iVar23 + -8;
            bVar29 = 0xf < iVar23;
            iVar23 = iVar18;
            iVar26 = iVar26 + -8;
          } while (bVar29);
        }
        bVar29 = 0 < iVar8;
        iVar8 = iVar8 + -1;
      } while (bVar29);
    }
    if (iVar18 != 0) {
      *pcVar24 = (char)(uVar14 << (8U - (char)iVar18 & 0x3f));
    }
    iVar23 = (int)pcVar24 - (int)pcVar22;
    lVar12 = (long)pcVar22 - (long)pcVar2;
    iVar26 = iVar18 + iVar23 * 8 + 7;
    iVar8 = iVar18 + iVar23 * 8 + 0xe;
    if (-1 < iVar26) {
      iVar8 = iVar26;
    }
    *compressed = (char)uVar9;
    compressed[1] = (char)(uVar9 >> 8);
    compressed[2] = (char)(uVar9 >> 0x10);
    compressed[3] = (char)(uVar9 >> 0x18);
    compressed[4] = (char)lVar11;
    compressed[5] = (char)((ulong)lVar11 >> 8);
    compressed[6] = (char)((ulong)lVar11 >> 0x10);
    compressed[7] = (char)((ulong)lVar11 >> 0x18);
    compressed[8] = (char)lVar12;
    compressed[9] = (char)((ulong)lVar12 >> 8);
    compressed[10] = (char)((ulong)lVar12 >> 0x10);
    compressed[0xb] = (char)((ulong)lVar12 >> 0x18);
    iVar18 = iVar18 + iVar23 * 8;
    compressed[0xc] = (char)iVar18;
    compressed[0xd] = (char)((uint)iVar18 >> 8);
    compressed[0xe] = (char)((uint)iVar18 >> 0x10);
    compressed[0xf] = (char)((uint)iVar18 >> 0x18);
    iVar18 = ((iVar8 >> 3) + (int)pcVar22) - (int)compressed;
    compressed[0x10] = '\0';
    compressed[0x11] = '\0';
    compressed[0x12] = '\0';
    compressed[0x13] = '\0';
    operator_delete__(__s);
  }
  return iVar18;
}

Assistant:

int
hufCompress (const unsigned short raw[],
	     int nRaw,
	     char compressed[])
{
    if (nRaw == 0)
	return 0;

    AutoArray <Int64, HUF_ENCSIZE> freq;

    countFrequencies (freq, raw, nRaw);

    int im = 0;
    int iM = 0;
    hufBuildEncTable (freq, &im, &iM);

    char *tableStart = compressed + 20;
    char *tableEnd   = tableStart;
    hufPackEncTable (freq, im, iM, &tableEnd);
    int tableLength = tableEnd - tableStart;

    char *dataStart = tableEnd;
    int nBits = hufEncode (freq, raw, nRaw, iM, dataStart);
    int dataLength = (nBits + 7) / 8;

    writeUInt (compressed,      im);
    writeUInt (compressed +  4, iM);
    writeUInt (compressed +  8, tableLength);
    writeUInt (compressed + 12, nBits);
    writeUInt (compressed + 16, 0);	// room for future extensions

    return dataStart + dataLength - compressed;
}